

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint uVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint8 *puVar5;
  jpgd_block_t *pjVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  if (this->m_comps_in_frame == 3) {
    if ((((this->m_comp_h_samp[1] != 1) || (this->m_comp_v_samp[1] != 1)) ||
        (this->m_comp_h_samp[2] != 1)) || (this->m_comp_v_samp[2] != 1)) goto LAB_00122ed5;
    uVar9 = this->m_comp_h_samp[0];
    uVar1 = this->m_comp_v_samp[0];
    if ((uVar9 ^ 1) == 0 && (uVar1 ^ 1) == 0) {
      uVar10 = 0x800000008;
      iVar4 = 3;
      iVar7 = 1;
    }
    else {
      iVar4 = 4;
      if (uVar9 == 2 && (uVar1 ^ 1) == 0) {
        uVar10 = 0x800000010;
        iVar7 = 2;
      }
      else if ((uVar9 ^ 1) == 0 && uVar1 == 2) {
        uVar10 = 0x1000000008;
        iVar7 = 3;
      }
      else {
        if ((uVar9 != 2) || (uVar1 != 2)) goto LAB_00122ed5;
        uVar10 = 0x1000000010;
        iVar4 = 6;
        iVar7 = 4;
      }
    }
  }
  else {
    if (this->m_comps_in_frame != 1) {
      stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
    }
    if ((this->m_comp_h_samp[0] != 1) || (this->m_comp_v_samp[0] != 1)) {
LAB_00122ed5:
      stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
    }
    iVar7 = 0;
    uVar10 = 0x800000008;
    iVar4 = 1;
  }
  this->m_scan_type = iVar7;
  this->m_max_blocks_per_mcu = iVar4;
  this->m_max_mcu_x_size = (int)uVar10;
  this->m_max_mcu_y_size = (int)((ulong)uVar10 >> 0x20);
  iVar4 = this->m_image_x_size;
  this->m_max_mcus_per_row = (iVar4 + (int)uVar10 + -1) / (int)uVar10;
  sVar2 = (iVar7 != 0) * '\x02';
  uVar9 = (iVar4 + 0xfU & 0xfff0) << sVar2;
  this->m_max_mcus_per_col =
       (this->m_image_y_size + this->m_max_mcu_y_size + -1) / this->m_max_mcu_y_size;
  this->m_dest_bytes_per_pixel = (uint)(iVar7 != 0) * 3 + 1;
  this->m_dest_bytes_per_scan_line = uVar9;
  this->m_real_dest_bytes_per_scan_line = iVar4 << sVar2;
  puVar5 = (uint8 *)alloc(this,(ulong)uVar9,true);
  this->m_pScan_line_0 = puVar5;
  if (this->m_scan_type - 3U < 2) {
    puVar5 = (uint8 *)alloc(this,(long)this->m_dest_bytes_per_scan_line,true);
    this->m_pScan_line_1 = puVar5;
  }
  iVar4 = this->m_max_mcus_per_row * this->m_max_blocks_per_mcu;
  this->m_max_blocks_per_row = iVar4;
  if (0x2000 < iVar4) {
    stop_decoding(this,JPGD_ASSERTION_ERROR);
  }
  pjVar6 = (jpgd_block_t *)alloc(this,(long)this->m_max_blocks_per_mcu << 7,false);
  this->m_pMCU_coefficients = pjVar6;
  auVar3 = _DAT_001b10b0;
  iVar4 = this->m_max_blocks_per_mcu;
  if (0 < (long)iVar4) {
    lVar8 = (long)iVar4 + -1;
    auVar11._8_4_ = (int)lVar8;
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar11 = auVar11 ^ _DAT_001b10b0;
    auVar12 = _DAT_001b1090;
    auVar14 = _DAT_001b10a0;
    do {
      auVar15 = auVar14 ^ auVar3;
      iVar7 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar7 && auVar11._0_4_ < auVar15._0_4_ || iVar7 < auVar15._4_4_)
                & 1)) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar8) = 0x40;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar8 + 4) = 0x40;
      }
      auVar15 = auVar12 ^ auVar3;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar7 && (iVar16 != iVar7 || auVar15._0_4_ <= auVar11._0_4_)) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar8 + 8) = 0x40;
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar8 + 0xc) = 0x40;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(iVar4 + 3U >> 2) << 4 != lVar8);
  }
  iVar7 = this->m_comp_v_samp[0] * this->m_comp_h_samp[0];
  this->m_expanded_blocks_per_component = iVar7;
  iVar7 = iVar7 * this->m_comps_in_frame;
  this->m_expanded_blocks_per_mcu = iVar7;
  iVar4 = this->m_max_mcus_per_row * iVar7;
  this->m_expanded_blocks_per_row = iVar4;
  this->m_freq_domain_chroma_upsample = iVar7 == 0xc;
  if (iVar7 != 0xc) {
    iVar4 = this->m_max_blocks_per_row;
  }
  puVar5 = (uint8 *)alloc(this,(long)(iVar4 << 6),false);
  this->m_pSample_buf = puVar5;
  this->m_total_lines_left = this->m_image_y_size;
  this->m_mcu_lines_left = 0;
  create_look_ups(this);
  return;
}

Assistant:

void jpeg_decoder::init_frame() {
  int i;

  if (m_comps_in_frame == 1) {
    if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

    m_scan_type = JPGD_GRAYSCALE;
    m_max_blocks_per_mcu = 1;
    m_max_mcu_x_size = 8;
    m_max_mcu_y_size = 8;
  } else if (m_comps_in_frame == 3) {
    if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
        ((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

    if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1)) {
      m_scan_type = JPGD_YH1V1;

      m_max_blocks_per_mcu = 3;
      m_max_mcu_x_size = 8;
      m_max_mcu_y_size = 8;
    } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1)) {
      m_scan_type = JPGD_YH2V1;
      m_max_blocks_per_mcu = 4;
      m_max_mcu_x_size = 16;
      m_max_mcu_y_size = 8;
    } else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2)) {
      m_scan_type = JPGD_YH1V2;
      m_max_blocks_per_mcu = 4;
      m_max_mcu_x_size = 8;
      m_max_mcu_y_size = 16;
    } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2)) {
      m_scan_type = JPGD_YH2V2;
      m_max_blocks_per_mcu = 6;
      m_max_mcu_x_size = 16;
      m_max_mcu_y_size = 16;
    } else
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
  } else
    stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

  m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
  m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

  // These values are for the *destination* pixels: after conversion.
  if (m_scan_type == JPGD_GRAYSCALE)
    m_dest_bytes_per_pixel = 1;
  else
    m_dest_bytes_per_pixel = 4;

  m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

  m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

  // Initialize two scan line buffers.
  m_pScan_line_0 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);
  if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
    m_pScan_line_1 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);

  m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

  // Should never happen
  if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
    stop_decoding(JPGD_ASSERTION_ERROR);

  // Allocate the coefficient buffer, enough for one MCU
  m_pMCU_coefficients = (jpgd_block_t*)alloc(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_t));

  for (i = 0; i < m_max_blocks_per_mcu; i++)
    m_mcu_block_max_zag[i] = 64;

  m_expanded_blocks_per_component = m_comp_h_samp[0] * m_comp_v_samp[0];
  m_expanded_blocks_per_mcu = m_expanded_blocks_per_component * m_comps_in_frame;
  m_expanded_blocks_per_row = m_max_mcus_per_row * m_expanded_blocks_per_mcu;
  // Freq. domain chroma upsampling is only supported for H2V2 subsampling factor (the most common one I've seen).
  m_freq_domain_chroma_upsample = false;
#if JPGD_SUPPORT_FREQ_DOMAIN_UPSAMPLING
  m_freq_domain_chroma_upsample = (m_expanded_blocks_per_mcu == 4 * 3);
#endif

  if (m_freq_domain_chroma_upsample)
    m_pSample_buf = (uint8*)alloc(m_expanded_blocks_per_row * 64);
  else
    m_pSample_buf = (uint8*)alloc(m_max_blocks_per_row * 64);

  m_total_lines_left = m_image_y_size;

  m_mcu_lines_left = 0;

  create_look_ups();
}